

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

VariableP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::bindExpression<float>
          (BuiltinPrecisionTests *this,string *name,ExpandContext *ctx,ExprP<float> *expr)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  SharedPtrStateBase *pSVar2;
  VariableP<float> VVar3;
  value_type local_28;
  
  ExpandContext::genSym<float>((ExpandContext *)this,(string *)ctx);
  variableStatement<float>((BuiltinPrecisionTests *)&local_28,(VariableP<float> *)this,expr,true);
  std::
  vector<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
  ::push_back(&ctx->m_statements,&local_28);
  pSVar2 = extraout_RDX;
  if (local_28.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_28.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>.m_state)
              ->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_28.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>.m_ptr =
           (Statement *)0x0;
      (*(local_28.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar2 = extraout_RDX_00;
    }
    LOCK();
    pdVar1 = &(local_28.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>.m_state)
              ->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_28.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_28.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>.m_state)->
        _vptr_SharedPtrStateBase[1])();
      pSVar2 = extraout_RDX_01;
    }
  }
  VVar3.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_state = pSVar2;
  VVar3.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr =
       (Variable<float> *)this;
  return (VariableP<float>)
         VVar3.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>;
}

Assistant:

VariableP<T> bindExpression (const string& name, ExpandContext& ctx, const ExprP<T>& expr)
{
	VariableP<T> var = ctx.genSym<T>(name);
	ctx.addStatement(variableDeclaration(var, expr));
	return var;
}